

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer puVar3;
  __uniq_ptr_data<cmInstallGenerator,_std::default_delete<cmInstallGenerator>,_true,_true> _Var4;
  bool bVar5;
  char cVar6;
  int iVar7;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *g;
  pointer puVar8;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar9;
  pointer puVar10;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_DEFAULT_BUILD_TYPE","")
  ;
  iVar7 = (*this->_vptr_cmGlobalGenerator[0x34])(this);
  bVar5 = UnsupportedVariableIsDefined(this,&local_50,SUB41(iVar7,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_CROSS_CONFIGS","");
    iVar7 = (*this->_vptr_cmGlobalGenerator[0x35])(this);
    bVar5 = UnsupportedVariableIsDefined(this,&local_50,SUB41(iVar7,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"CMAKE_DEFAULT_CONFIGS","");
      iVar7 = (*this->_vptr_cmGlobalGenerator[0x36])(this);
      bVar5 = UnsupportedVariableIsDefined(this,&local_50,SUB41(iVar7,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar5) && (iVar7 = (*this->_vptr_cmGlobalGenerator[0xd])(this), (char)iVar7 != '\0')) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(&this->FilesReplacedDuringGenerate,
                          (this->FilesReplacedDuringGenerate).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->CMP0042WarnTargets)._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->CMP0068WarnTargets)._M_t);
        iVar7 = (*this->_vptr_cmGlobalGenerator[0x3c])(this);
        if ((char)iVar7 != '\0') {
          FinalizeTargetConfiguration(this);
          CreateGenerationObjects(this,AllTargets);
          FillProjectMap(this);
          AddAutomaticSources(this);
          bVar5 = AddHeaderSetVerification(this);
          if (!bVar5) {
            return false;
          }
          bVar5 = QtAutoGen(this);
          if (bVar5) {
            puVar9 = (this->LocalGenerators).
                     super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar10 = (this->LocalGenerators).
                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (puVar9 != puVar10) {
              do {
                (*((puVar9->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                  _vptr_cmLocalGenerator[4])();
                puVar9 = puVar9 + 1;
              } while (puVar9 != puVar10);
              puVar9 = (this->LocalGenerators).
                       super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar10 = (this->LocalGenerators).
                        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (puVar9 != puVar10) {
                do {
                  bVar5 = cmLocalGenerator::ComputeTargetCompileFeatures
                                    ((puVar9->_M_t).
                                     super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                                     .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)
                  ;
                  if (!bVar5) {
                    return false;
                  }
                  puVar9 = puVar9 + 1;
                } while (puVar9 != puVar10);
                puVar9 = (this->LocalGenerators).
                         super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar10 = (this->LocalGenerators).
                          super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              for (; puVar9 != puVar10; puVar9 = puVar9 + 1) {
                pcVar2 = ((puVar9->_M_t).
                          super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                          .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
                puVar3 = (pcVar2->InstallGenerators).
                         super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (puVar8 = *(pointer *)
                               &(pcVar2->InstallGenerators).
                                super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                                ._M_impl; puVar8 != puVar3; puVar8 = puVar8 + 1) {
                  _Var4.
                  super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                  .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl =
                       (puVar8->_M_t).
                       super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                  ;
                  cVar6 = (**(code **)(*(long *)_Var4.
                                                super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                                .super__Head_base<0UL,_cmInstallGenerator_*,_false>.
                                                _M_head_impl + 0x50))
                                    (_Var4.
                                     super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                     .super__Head_base<0UL,_cmInstallGenerator_*,_false>.
                                     _M_head_impl,
                                     (puVar9->_M_t).
                                     super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                                     .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)
                  ;
                  if (cVar6 == '\0') {
                    return false;
                  }
                }
              }
            }
            (*this->_vptr_cmGlobalGenerator[0xe])(this);
            puVar10 = (this->LocalGenerators).
                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar9 = (this->LocalGenerators).
                          super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar10;
                puVar9 = puVar9 + 1) {
              cmLocalGenerator::TraceDependencies
                        ((puVar9->_M_t).
                         super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                         .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
            }
            bVar5 = CheckTargetsForMissingSources(this);
            if (!bVar5) {
              (*this->_vptr_cmGlobalGenerator[0x3e])(this);
              puVar10 = (this->LocalGenerators).
                        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (puVar9 = (this->LocalGenerators).
                            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar10;
                  puVar9 = puVar9 + 1) {
                cmLocalGenerator::ComputeTargetManifest
                          ((puVar9->_M_t).
                           super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                           .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
              }
              iVar7 = (*this->_vptr_cmGlobalGenerator[0x3b])(this);
              if ((char)iVar7 != '\0') {
                ComputeTargetOrder(this);
                bVar5 = CheckTargetsForType(this);
                if ((!bVar5) && (bVar5 = CheckTargetsForPchCompilePdb(this), !bVar5)) {
                  puVar10 = (this->LocalGenerators).
                            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (puVar9 = (this->LocalGenerators).
                                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar10;
                      puVar9 = puVar9 + 1) {
                    (*((puVar9->_M_t).
                       super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                       .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                      _vptr_cmLocalGenerator[3])();
                  }
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Make sure unsupported variables are not used.
  if (this->UnsupportedVariableIsDefined("CMAKE_DEFAULT_BUILD_TYPE",
                                         this->SupportsDefaultBuildType())) {
    return false;
  }
  if (this->UnsupportedVariableIsDefined("CMAKE_CROSS_CONFIGS",
                                         this->SupportsCrossConfigs())) {
    return false;
  }
  if (this->UnsupportedVariableIsDefined("CMAKE_DEFAULT_CONFIGS",
                                         this->SupportsDefaultConfigs())) {
    return false;
  }
  if (!this->InspectConfigTypeVariables()) {
    return false;
  }

  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();
  // clear targets to issue warning CMP0068 for
  this->CMP0068WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if (!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS()) {
    return false;
  }
  this->FinalizeTargetConfiguration();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

  // Add automatically generated sources (e.g. unity build).
  if (!this->AddAutomaticSources()) {
    return false;
  }

  // Iterate through all targets and add verification targets for header sets
  if (!this->AddHeaderSetVerification()) {
    return false;
  }

  // Iterate through all targets and set up AUTOMOC, AUTOUIC and AUTORCC
  if (!this->QtAutoGen()) {
    return false;
  }

  // Add generator specific helper commands
  for (const auto& localGen : this->LocalGenerators) {
    localGen->AddHelperCommands();
  }

  // Perform up-front computation in order to handle errors (such as unknown
  // features) at this point. While processing the compile features we also
  // calculate and cache the language standard required by the compile
  // features.
  for (const auto& localGen : this->LocalGenerators) {
    if (!localGen->ComputeTargetCompileFeatures()) {
      return false;
    }
  }

  for (const auto& localGen : this->LocalGenerators) {
    cmMakefile* mf = localGen->GetMakefile();
    for (const auto& g : mf->GetInstallGenerators()) {
      if (!g->Compute(localGen.get())) {
        return false;
      }
    }
  }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (const auto& localGen : this->LocalGenerators) {
    localGen->TraceDependencies();
  }

  // Make sure that all (non-imported) targets have source files added!
  if (this->CheckTargetsForMissingSources()) {
    return false;
  }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (const auto& localGen : this->LocalGenerators) {
    localGen->ComputeTargetManifest();
  }

  // Compute the inter-target dependencies.
  if (!this->ComputeTargetDepends()) {
    return false;
  }
  this->ComputeTargetOrder();

  if (this->CheckTargetsForType()) {
    return false;
  }

  if (this->CheckTargetsForPchCompilePdb()) {
    return false;
  }

  for (const auto& localGen : this->LocalGenerators) {
    localGen->ComputeHomeRelativeOutputPath();
  }

  return true;
}